

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O0

void __thiscall
despot::Planner::EvaluationLoop
          (Planner *this,DSPOMDP *model,World *world,Belief *belief,string *belief_type,
          Solver **solver,Logger *logger,Option *options,clock_t main_clock_start,int num_runs,
          int start_run)

{
  int iVar1;
  undefined4 extraout_var;
  Belief *pBVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  log_ostream *plVar3;
  char *pcVar4;
  ostream *poVar5;
  reference pvVar6;
  value_type extraout_XMM0_Qa;
  double round_reward;
  double local_78;
  double end_t;
  double start_t;
  int round;
  allocator<double> local_51;
  undefined1 local_50 [8];
  vector<double,_std::allocator<double>_> round_rewards;
  Solver **solver_local;
  string *belief_type_local;
  Belief *belief_local;
  World *world_local;
  DSPOMDP *model_local;
  Planner *this_local;
  
  round_rewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)solver;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_50,(long)num_runs,&local_51);
  std::allocator<double>::~allocator(&local_51);
  for (start_t._0_4_ = start_run; start_t._0_4_ < start_run + num_runs;
      start_t._0_4_ = start_t._0_4_ + 1) {
    this->round_ = start_t._0_4_;
    this->step_ = 0;
    if ((DAT_00278ac0 & 1) == 0) {
      poVar5 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"####################################### Round ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,start_t._0_4_);
      poVar5 = std::operator<<(poVar5," #######################################");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    (*world->_vptr_World[3])();
    iVar1 = (*world->_vptr_World[4])();
    (*logger->_vptr_Logger[2])(logger,CONCAT44(extraout_var,iVar1));
    end_t = get_time_second();
    pBVar2 = Solver::belief((Solver *)
                            *round_rewards.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pBVar2 != (Belief *)0x0) {
      (*pBVar2->_vptr_Belief[1])();
    }
    local_78 = get_time_second();
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 2 < iVar1)) {
      plVar3 = logging::stream(3);
      poVar5 = std::operator<<(&plVar3->super_ostream,
                               "[Initializer::EvaluationLoop] Deleted old belief in ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_78 - end_t);
      poVar5 = std::operator<<(poVar5,"s");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    end_t = get_time_second();
    iVar1 = (*world->_vptr_World[4])();
    std::__cxx11::string::string((string *)&round_reward,(string *)belief_type);
    iVar1 = (*model->_vptr_DSPOMDP[9])(model,CONCAT44(extraout_var_00,iVar1),&round_reward);
    pBVar2 = (Belief *)CONCAT44(extraout_var_01,iVar1);
    std::__cxx11::string::~string((string *)&round_reward);
    local_78 = get_time_second();
    iVar1 = logging::level();
    if ((0 < iVar1) && (iVar1 = logging::level(), 2 < iVar1)) {
      plVar3 = logging::stream(3);
      poVar5 = std::operator<<(&plVar3->super_ostream,
                               "[Initializer::EvaluationLoop] Created intial belief ");
      if (pBVar2 == (Belief *)0x0) {
        __cxa_bad_typeid();
      }
      pcVar4 = std::type_info::name((type_info *)pBVar2->_vptr_Belief[-1]);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," in ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_78 - end_t);
      poVar5 = std::operator<<(poVar5,"s");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    (**(code **)(*(long *)*round_rewards.super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 0x20))
              ((long *)*round_rewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,pBVar2);
    Logger::belief(logger,pBVar2);
    (*(this->super_PlannerBase)._vptr_PlannerBase[8])
              (this,round_rewards.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,world,logger);
    if ((DAT_00278ac0 & 1) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Simulation terminated in ");
      iVar1 = Logger::step(logger);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
      poVar5 = std::operator<<(poVar5," steps");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    (*logger->_vptr_Logger[3])();
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_50,(long)start_t._0_4_);
    *pvVar6 = extraout_XMM0_Qa;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_50);
  return;
}

Assistant:

void Planner::EvaluationLoop(DSPOMDP *model, World* world, Belief* belief,
		string belief_type, Solver *&solver, Logger *logger,
		option::Option *options, clock_t main_clock_start, int num_runs,
		int start_run) {
	// Run num_runs simulations
	vector<double> round_rewards(num_runs);
	for (int round = start_run; round < start_run + num_runs; round++) {
		round_=round;
		step_=0;
		default_out<< endl
		<< "####################################### Round " << round
		<< " #######################################" << endl;
		//Reset world and logger
		world->Initialize();
		logger->InitRound(world->GetCurrentState());

		//Reset belief and solver
		double start_t = get_time_second();
		delete solver->belief();
		double end_t = get_time_second();
		logi << "[Initializer::EvaluationLoop] Deleted old belief in "
		<< (end_t - start_t) << "s" << endl;

		start_t = get_time_second();
		belief=model->InitialBelief(world->GetCurrentState(), belief_type);
		end_t = get_time_second();
		logi << "[Initializer::EvaluationLoop] Created intial belief "
		<< typeid(*belief).name() << " in " << (end_t - start_t) << "s" << endl;

		solver->belief(belief);
		logger->belief(belief);

		//start loop
		PlanningLoop(solver, world, logger);
		//end loop

		default_out << "Simulation terminated in " << logger->step() << " steps"
		<< endl;
		double round_reward = logger->EndRound();
		round_rewards[round] = round_reward;
	}
}